

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

size_t ZSTD_decodeSeqHeaders(ZSTD_DCtx *dctx,int *nbSeqPtr,void *src,size_t srcSize)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  U32 UVar4;
  int iVar5;
  U16 UVar6;
  int iVar7;
  uint uVar8;
  byte *pbVar9;
  size_t sVar10;
  byte *memPtr;
  size_t mlhSize;
  size_t ofhSize;
  size_t llhSize;
  symbolEncodingType_e MLtype;
  symbolEncodingType_e OFtype;
  symbolEncodingType_e LLtype;
  int nbSeq;
  BYTE *ip;
  BYTE *iend;
  BYTE *istart;
  size_t srcSize_local;
  void *src_local;
  int *nbSeqPtr_local;
  ZSTD_DCtx *dctx_local;
  
  pbVar9 = (byte *)((long)src + srcSize);
  if (srcSize == 0) {
    dctx_local = (ZSTD_DCtx *)0xffffffffffffffb8;
  }
  else {
    memPtr = (byte *)((long)src + 1);
    OFtype = (symbolEncodingType_e)*src;
    if (OFtype == set_basic) {
      *nbSeqPtr = 0;
      if (srcSize == 1) {
        dctx_local = (ZSTD_DCtx *)0x1;
      }
      else {
        dctx_local = (ZSTD_DCtx *)0xffffffffffffffb8;
      }
    }
    else {
      _LLtype = memPtr;
      if (0x7f < OFtype) {
        if (OFtype == 0xff) {
          if (pbVar9 < (byte *)((long)src + 3)) {
            return 0xffffffffffffffb8;
          }
          UVar6 = MEM_readLE16(memPtr);
          OFtype = UVar6 + 0x7f00;
          _LLtype = (byte *)((long)src + 3);
        }
        else {
          if (pbVar9 <= memPtr) {
            return 0xffffffffffffffb8;
          }
          _LLtype = (byte *)((long)src + 2);
          OFtype = (OFtype - 0x80) * 0x100 + (uint)*memPtr;
        }
      }
      *nbSeqPtr = OFtype;
      if (pbVar9 < _LLtype + 1) {
        dctx_local = (ZSTD_DCtx *)0xffffffffffffffb8;
      }
      else {
        bVar1 = *_LLtype;
        bVar2 = *_LLtype;
        bVar3 = *_LLtype;
        _LLtype = _LLtype + 1;
        UVar4 = dctx->fseEntropy;
        iVar5 = dctx->ddictIsCold;
        iVar7 = ZSTD_DCtx_get_bmi2(dctx);
        sVar10 = ZSTD_buildSeqTable((dctx->entropy).LLTable,&dctx->LLTptr,(int)(uint)bVar1 >> 6,0x23
                                    ,9,_LLtype,(long)pbVar9 - (long)_LLtype,LL_base,"",
                                    LL_defaultDTable,UVar4,iVar5,OFtype,dctx->workspace,0xa00,iVar7)
        ;
        uVar8 = ERR_isError(sVar10);
        if (uVar8 == 0) {
          _LLtype = _LLtype + sVar10;
          UVar4 = dctx->fseEntropy;
          iVar5 = dctx->ddictIsCold;
          iVar7 = ZSTD_DCtx_get_bmi2(dctx);
          sVar10 = ZSTD_buildSeqTable((dctx->entropy).OFTable,&dctx->OFTptr,
                                      (int)(uint)bVar2 >> 4 & set_repeat,0x1f,8,_LLtype,
                                      (long)pbVar9 - (long)_LLtype,OF_base,"",OF_defaultDTable,UVar4
                                      ,iVar5,OFtype,dctx->workspace,0xa00,iVar7);
          uVar8 = ERR_isError(sVar10);
          if (uVar8 == 0) {
            _LLtype = _LLtype + sVar10;
            UVar4 = dctx->fseEntropy;
            iVar5 = dctx->ddictIsCold;
            iVar7 = ZSTD_DCtx_get_bmi2(dctx);
            sVar10 = ZSTD_buildSeqTable((dctx->entropy).MLTable,&dctx->MLTptr,
                                        (int)(uint)bVar3 >> 2 & set_repeat,0x34,9,_LLtype,
                                        (long)pbVar9 - (long)_LLtype,ML_base,"",ML_defaultDTable,
                                        UVar4,iVar5,OFtype,dctx->workspace,0xa00,iVar7);
            uVar8 = ERR_isError(sVar10);
            if (uVar8 == 0) {
              dctx_local = (ZSTD_DCtx *)(_LLtype + (sVar10 - (long)src));
            }
            else {
              dctx_local = (ZSTD_DCtx *)0xffffffffffffffec;
            }
          }
          else {
            dctx_local = (ZSTD_DCtx *)0xffffffffffffffec;
          }
        }
        else {
          dctx_local = (ZSTD_DCtx *)0xffffffffffffffec;
        }
      }
    }
  }
  return (size_t)dctx_local;
}

Assistant:

size_t ZSTD_decodeSeqHeaders(ZSTD_DCtx* dctx, int* nbSeqPtr,
                             const void* src, size_t srcSize)
{
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* const iend = istart + srcSize;
    const BYTE* ip = istart;
    int nbSeq;
    DEBUGLOG(5, "ZSTD_decodeSeqHeaders");

    /* check */
    RETURN_ERROR_IF(srcSize < MIN_SEQUENCES_SIZE, srcSize_wrong, "");

    /* SeqHead */
    nbSeq = *ip++;
    if (!nbSeq) {
        *nbSeqPtr=0;
        RETURN_ERROR_IF(srcSize != 1, srcSize_wrong, "");
        return 1;
    }
    if (nbSeq > 0x7F) {
        if (nbSeq == 0xFF) {
            RETURN_ERROR_IF(ip+2 > iend, srcSize_wrong, "");
            nbSeq = MEM_readLE16(ip) + LONGNBSEQ;
            ip+=2;
        } else {
            RETURN_ERROR_IF(ip >= iend, srcSize_wrong, "");
            nbSeq = ((nbSeq-0x80)<<8) + *ip++;
        }
    }
    *nbSeqPtr = nbSeq;

    /* FSE table descriptors */
    RETURN_ERROR_IF(ip+1 > iend, srcSize_wrong, ""); /* minimum possible size: 1 byte for symbol encoding types */
    {   symbolEncodingType_e const LLtype = (symbolEncodingType_e)(*ip >> 6);
        symbolEncodingType_e const OFtype = (symbolEncodingType_e)((*ip >> 4) & 3);
        symbolEncodingType_e const MLtype = (symbolEncodingType_e)((*ip >> 2) & 3);
        ip++;

        /* Build DTables */
        {   size_t const llhSize = ZSTD_buildSeqTable(dctx->entropy.LLTable, &dctx->LLTptr,
                                                      LLtype, MaxLL, LLFSELog,
                                                      ip, iend-ip,
                                                      LL_base, LL_bits,
                                                      LL_defaultDTable, dctx->fseEntropy,
                                                      dctx->ddictIsCold, nbSeq,
                                                      dctx->workspace, sizeof(dctx->workspace),
                                                      ZSTD_DCtx_get_bmi2(dctx));
            RETURN_ERROR_IF(ZSTD_isError(llhSize), corruption_detected, "ZSTD_buildSeqTable failed");
            ip += llhSize;
        }

        {   size_t const ofhSize = ZSTD_buildSeqTable(dctx->entropy.OFTable, &dctx->OFTptr,
                                                      OFtype, MaxOff, OffFSELog,
                                                      ip, iend-ip,
                                                      OF_base, OF_bits,
                                                      OF_defaultDTable, dctx->fseEntropy,
                                                      dctx->ddictIsCold, nbSeq,
                                                      dctx->workspace, sizeof(dctx->workspace),
                                                      ZSTD_DCtx_get_bmi2(dctx));
            RETURN_ERROR_IF(ZSTD_isError(ofhSize), corruption_detected, "ZSTD_buildSeqTable failed");
            ip += ofhSize;
        }

        {   size_t const mlhSize = ZSTD_buildSeqTable(dctx->entropy.MLTable, &dctx->MLTptr,
                                                      MLtype, MaxML, MLFSELog,
                                                      ip, iend-ip,
                                                      ML_base, ML_bits,
                                                      ML_defaultDTable, dctx->fseEntropy,
                                                      dctx->ddictIsCold, nbSeq,
                                                      dctx->workspace, sizeof(dctx->workspace),
                                                      ZSTD_DCtx_get_bmi2(dctx));
            RETURN_ERROR_IF(ZSTD_isError(mlhSize), corruption_detected, "ZSTD_buildSeqTable failed");
            ip += mlhSize;
        }
    }

    return ip-istart;
}